

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O1

DWORD GetFullPathNameA(LPCSTR lpFileName,DWORD nBufferLength,LPSTR lpBuffer,LPSTR *lpFilePart)

{
  FILE *__stream;
  DWORD DVar1;
  errno_t eVar2;
  char *lpBuffer_00;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  size_t szSize;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_002c23f4;
  if (lpFileName == (LPCSTR)0x0) {
    DVar1 = 0x57;
LAB_002c22b6:
    SetLastError(DVar1);
    DVar1 = 0;
    lpBuffer_00 = (LPSTR)0x0;
  }
  else if ((*lpFileName == '\\') || (*lpFileName == '/')) {
    lpBuffer_00 = PAL__strdup(lpFileName);
    if (lpBuffer_00 == (char *)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_002c23f4;
      piVar4 = __errno_location();
      strerror(*piVar4);
      DVar1 = 8;
      goto LAB_002c22b6;
    }
LAB_002c21d4:
    FILEDosToUnixPathA(lpBuffer_00);
    FILECanonicalizePath(lpBuffer_00);
    sVar3 = strlen(lpBuffer_00);
    DVar1 = (DWORD)sVar3;
    if (nBufferLength < DVar1 + 1) {
      DVar1 = DVar1 + 1;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_002c23f4;
    }
    else {
      strcpy_s(lpBuffer,(ulong)nBufferLength,lpBuffer_00);
      if (lpFilePart != (LPSTR *)0x0) {
        pcVar5 = strrchr(lpBuffer,0x2f);
        *lpFilePart = pcVar5;
        if (pcVar5 == (char *)0x0) {
          fprintf(_stderr,"] %s %s:%d","GetFullPathNameA",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
                  ,0xa3);
          fprintf(_stderr,"Not able to find \'/\' in the full path.\n");
          goto LAB_002c23c3;
        }
        *lpFilePart = pcVar5 + 1;
      }
    }
  }
  else {
    sVar3 = strlen(lpFileName);
    szSize = sVar3 + 0x402;
    lpBuffer_00 = (char *)PAL_malloc(szSize);
    if (lpBuffer_00 == (LPSTR)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_002c23f4;
      piVar4 = __errno_location();
      strerror(*piVar4);
      DVar1 = 8;
    }
    else {
      DVar1 = GetCurrentDirectoryA(0x401,lpBuffer_00);
      if (DVar1 == 0) {
        fprintf(_stderr,"] %s %s:%d","GetFullPathNameA",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
                ,0x74);
        __stream = _stderr;
        DVar1 = GetLastError();
        fprintf(__stream,"GetCurrentDirectoryA() failed! lasterror is %#xd\n",(ulong)DVar1);
LAB_002c23c3:
        DVar1 = 0;
        SetLastError(0x54f);
        goto LAB_002c23d4;
      }
      eVar2 = strcat_s(lpBuffer_00,szSize,"/");
      if ((eVar2 == 0) && (eVar2 = strcat_s(lpBuffer_00,szSize,lpFileName), eVar2 == 0))
      goto LAB_002c21d4;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_002c23f4;
      DVar1 = 0xce;
    }
    SetLastError(DVar1);
    DVar1 = 0;
  }
LAB_002c23d4:
  PAL_free(lpBuffer_00);
  if (PAL_InitializeChakraCoreCalled != false) {
    return DVar1;
  }
LAB_002c23f4:
  abort();
}

Assistant:

DWORD
PALAPI
GetFullPathNameA(
     IN LPCSTR lpFileName,
     IN DWORD nBufferLength,
     OUT LPSTR lpBuffer,
     OUT LPSTR *lpFilePart)
{
    DWORD  nReqPathLen, nRet = 0;
    LPSTR lpUnixPath = NULL;
    BOOL fullPath = FALSE;

    PERF_ENTRY(GetFullPathNameA);
    ENTRY("GetFullPathNameA(lpFileName=%p (%s), nBufferLength=%u, lpBuffer=%p, "
          "lpFilePart=%p)\n",
          lpFileName?lpFileName:"NULL",
          lpFileName?lpFileName:"NULL", nBufferLength, lpBuffer, lpFilePart);

    if(NULL == lpFileName)
    {
        WARN("lpFileName is NULL\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    /* find out if lpFileName is a partial or full path */
    if ('\\' == *lpFileName || '/' == *lpFileName)
    {
        fullPath = TRUE;
    }

    if(fullPath)
    {
        lpUnixPath = PAL__strdup( lpFileName );
        if(NULL == lpUnixPath)
        {
            ERROR("strdup() failed; error is %d (%s)\n",
                  errno, strerror(errno));
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }
    }
    else
    {
        size_t max_len;

        /* allocate memory for full non-canonical path */
        max_len = strlen(lpFileName)+1; /* 1 for the slash to append */
        max_len += MAX_LONGPATH + 1;
        lpUnixPath = (LPSTR)PAL_malloc(max_len);
        if(NULL == lpUnixPath)
        {
            ERROR("PAL_malloc() failed; error is %d (%s)\n",
                  errno, strerror(errno));
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }

        /* build full path */
        if(!GetCurrentDirectoryA(MAX_LONGPATH + 1, lpUnixPath))
        {
            /* no reason for this to fail now... */
            ASSERT("GetCurrentDirectoryA() failed! lasterror is %#xd\n",
                   GetLastError());
            SetLastError(ERROR_INTERNAL_ERROR);
            goto done;
        }

        if (strcat_s(lpUnixPath, max_len, "/") != SAFECRT_SUCCESS)
        {
            ERROR("strcat_s failed!\n");
            SetLastError(ERROR_FILENAME_EXCED_RANGE);
            goto done;
        }

        if (strcat_s(lpUnixPath, max_len, lpFileName) != SAFECRT_SUCCESS)
        {
            ERROR("strcat_s failed!\n");
            SetLastError(ERROR_FILENAME_EXCED_RANGE);
            goto done;
        }
    }

    /* do conversion to Unix path */
    FILEDosToUnixPathA( lpUnixPath );

    /* now we can canonicalize this */
    FILECanonicalizePath(lpUnixPath);

    /* at last, we can figure out how long this path is */
    nReqPathLen = strlen(lpUnixPath)+1;

    if(nBufferLength < nReqPathLen)
    {
        TRACE("reporting insufficient buffer : minimum is %d, caller "
              "provided %d\n", nReqPathLen, nBufferLength);
        nRet = nReqPathLen;
        goto done;
    }

    nRet = nReqPathLen-1;
    strcpy_s(lpBuffer, nBufferLength, lpUnixPath);

    /* locate the filename component if caller cares */
    if(lpFilePart)
    {
        *lpFilePart = strrchr(lpBuffer, '/');

        if (*lpFilePart == NULL)
        {
            ASSERT("Not able to find '/' in the full path.\n");
            SetLastError( ERROR_INTERNAL_ERROR );
            nRet = 0;
            goto done;
        }
        else
        {
            (*lpFilePart)++;
        }
    }

done:
    PAL_free (lpUnixPath);
    LOGEXIT("GetFullPathNameA returns DWORD %u\n", nRet);
    PERF_EXIT(GetFullPathNameA);
    return nRet;
}